

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float128 float128_mul_mips64(float128 a,float128 b,float_status *status)

{
  byte zSign;
  uint64_t uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  int32_t zExp;
  float128 fVar19;
  int32_t aExp;
  int32_t bExp;
  uint32_t aLow;
  uint64_t aSig1;
  uint local_a4;
  ulong local_a0;
  long local_98;
  float_status *local_90;
  uint local_84;
  ulong local_80;
  ulong local_78;
  uint64_t local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  uint64_t local_40;
  ulong local_38;
  
  uVar1 = b.low;
  local_70 = a.low;
  local_68 = a.high & 0xffffffffffff;
  local_a4 = a.high._6_2_ & 0x7fff;
  uVar13 = b.high & 0xffffffffffff;
  uVar18 = b.high._6_2_ & 0x7fff;
  uVar15 = b.high ^ a.high;
  local_84 = uVar18;
  local_40 = uVar1;
  local_38 = uVar13;
  if (local_a4 == 0x7fff) {
    if ((((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
         local_70 != 0) ||
       ((((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        uVar1 != 0) && uVar18 == 0x7fff)) {
LAB_00870545:
      fVar19 = propagateFloat128NaN(a,b,status);
      return fVar19;
    }
    if ((((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0 &&
        uVar1 == 0) &&
        ((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0) {
LAB_008705aa:
      status->float_exception_flags = status->float_exception_flags | 1;
      uVar13 = 0x2000000000000000;
      if (status->snan_bit_is_one != '\0') {
        uVar13 = 0x1fffffffffffffff;
      }
      uVar1 = -(ulong)((uint)uVar13 & 1);
      uVar15 = uVar13 >> 0xe | 0x7fff000000000000;
      goto LAB_00870847;
    }
  }
  else {
    if (uVar18 != 0x7fff) {
      if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
        if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
            local_70 != 0) {
          normalizeFloat128Subnormal(local_68,local_70,(int32_t *)&local_a4,&local_68,&local_70);
          goto LAB_00870589;
        }
      }
      else {
LAB_00870589:
        local_90 = status;
        if (((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) != (undefined1  [16])0x0) {
LAB_00870622:
          uVar13 = uVar13 << 0x10;
          uVar14 = uVar13 | uVar1 >> 0x30;
          uVar7 = local_68 | 0x1000000000000;
          uVar17 = uVar1 * 0x10000;
          uVar10 = local_70 >> 0x20;
          local_50 = uVar17 >> 0x20;
          local_80 = local_70;
          uVar3 = (local_70 & 0xffffffff) * local_50;
          uVar5 = uVar10 * (uVar17 & 0xffffffff);
          uVar6 = uVar5 + uVar3;
          local_78 = local_70 * uVar17;
          uVar4 = uVar13 >> 0x20;
          uVar2 = (local_70 & 0xffffffff) * uVar4;
          uVar9 = uVar13 & 0xffffffff | uVar1 >> 0x30;
          uVar8 = uVar10 * uVar9;
          uVar13 = uVar8 + uVar2;
          local_60 = uVar13 >> 0x20;
          uVar16 = local_70 * uVar14;
          local_58 = (ulong)(uVar16 < uVar13 << 0x20);
          uVar11 = uVar10 * local_50 + uVar16 + (uVar6 >> 0x20) +
                   ((ulong)CARRY8(uVar5,uVar3) << 0x20) + (ulong)(local_78 < uVar6 << 0x20);
          uVar12 = uVar7 >> 0x20;
          uVar13 = uVar4 * (local_68 & 0xffffffff);
          uVar9 = uVar9 * uVar12;
          uVar5 = uVar9 + uVar13;
          local_98 = (ulong)CARRY8(uVar9,uVar13) << 0x20;
          uVar14 = uVar14 * uVar7;
          local_a0 = (ulong)(uVar14 < uVar5 << 0x20);
          uVar6 = uVar10 * uVar4 + uVar14 + local_60 + ((ulong)CARRY8(uVar8,uVar2) << 0x20) +
                  local_58 + (ulong)(uVar11 < uVar16);
          uVar13 = (local_68 & 0xffffffff) * local_50;
          uVar2 = (uVar17 & 0xffffffff) * uVar12;
          uVar3 = uVar2 + uVar13;
          uVar17 = uVar17 * uVar7;
          uVar2 = (uVar3 >> 0x20) + uVar12 * local_50 + ((ulong)CARRY8(uVar2,uVar13) << 0x20) +
                  (ulong)(uVar17 < uVar3 << 0x20) + (ulong)CARRY8(uVar17,uVar11);
          uVar3 = uVar2 + uVar6;
          uVar13 = uVar3 + local_70;
          uVar1 = uVar4 * uVar12 + uVar7 + (uVar5 >> 0x20) + local_98 + local_a0 +
                  (ulong)(uVar6 < uVar14) + (ulong)CARRY8(uVar2,uVar6) +
                  (ulong)CARRY8(uVar3,local_70);
          uVar2 = (ulong)(local_78 != 0) | uVar17 + uVar11;
          if (uVar1 >> 0x31 == 0) {
            zExp = uVar18 + local_a4 + -0x4000;
          }
          else {
            uVar3 = uVar1 << 0x3f;
            uVar1 = uVar1 >> 1;
            uVar2 = (ulong)(uVar2 != 0) | uVar13 << 0x3f;
            zExp = uVar18 + local_a4 + -0x3fff;
            uVar13 = uVar3 | uVar13 >> 1;
          }
          local_48._0_1_ = (byte)(uVar15 >> 0x3f);
          zSign = (byte)local_48;
          local_48 = uVar15 >> 0x3f;
          fVar19 = roundAndPackFloat128(zSign,zExp,uVar1,uVar13,uVar2,local_90);
          return fVar19;
        }
        if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
            uVar1 != 0) {
          normalizeFloat128Subnormal(uVar13,uVar1,(int32_t *)&local_84,&local_38,&local_40);
          uVar13 = local_38;
          uVar1 = local_40;
          uVar18 = local_84;
          goto LAB_00870622;
        }
      }
      uVar15 = uVar15 & 0x8000000000000000;
      uVar1 = 0;
      goto LAB_00870847;
    }
    if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        uVar1 != 0) goto LAB_00870545;
    if ((((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0 &&
        local_70 == 0) &&
        ((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0)
    goto LAB_008705aa;
  }
  uVar15 = uVar15 & 0x8000000000000000 | 0x7fff000000000000;
  uVar1 = 0;
LAB_00870847:
  fVar19.high = uVar15;
  fVar19.low = uVar1;
  return fVar19;
}

Assistant:

float128 float128_mul(float128 a, float128 b, float_status *status)
{
    flag aSign, bSign, zSign;
    int32_t aExp, bExp, zExp;
    uint64_t aSig0, aSig1, bSig0, bSig1, zSig0, zSig1, zSig2, zSig3;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    bSign = extractFloat128Sign( b );
    zSign = aSign ^ bSign;
    if ( aExp == 0x7FFF ) {
        if (    ( aSig0 | aSig1 )
             || ( ( bExp == 0x7FFF ) && ( bSig0 | bSig1 ) ) ) {
            return propagateFloat128NaN(a, b, status);
        }
        if ( ( bExp | bSig0 | bSig1 ) == 0 ) goto invalid;
        return packFloat128( zSign, 0x7FFF, 0, 0 );
    }
    if ( bExp == 0x7FFF ) {
        if (bSig0 | bSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        if ( ( aExp | aSig0 | aSig1 ) == 0 ) {
 invalid:
            float_raise(float_flag_invalid, status);
            return float128_default_nan(status);
        }
        return packFloat128( zSign, 0x7FFF, 0, 0 );
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return packFloat128( zSign, 0, 0, 0 );
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    if ( bExp == 0 ) {
        if ( ( bSig0 | bSig1 ) == 0 ) return packFloat128( zSign, 0, 0, 0 );
        normalizeFloat128Subnormal( bSig0, bSig1, &bExp, &bSig0, &bSig1 );
    }
    zExp = aExp + bExp - 0x4000;
    aSig0 |= UINT64_C(0x0001000000000000);
    shortShift128Left( bSig0, bSig1, 16, &bSig0, &bSig1 );
    mul128To256( aSig0, aSig1, bSig0, bSig1, &zSig0, &zSig1, &zSig2, &zSig3 );
    add128( zSig0, zSig1, aSig0, aSig1, &zSig0, &zSig1 );
    zSig2 |= ( zSig3 != 0 );
    if (UINT64_C( 0x0002000000000000) <= zSig0 ) {
        shift128ExtraRightJamming(
            zSig0, zSig1, zSig2, 1, &zSig0, &zSig1, &zSig2 );
        ++zExp;
    }
    return roundAndPackFloat128(zSign, zExp, zSig0, zSig1, zSig2, status);

}